

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

bool __thiscall smf::MidiFile::writeHex(MidiFile *this,ostream *out,int width)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  ostream *this_00;
  size_t in_RCX;
  void *__buf;
  int iVar4;
  char cVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long local_1d8;
  uint local_1d0;
  stringstream tempstream;
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&tempstream);
  write(this,(int)local_1a8,__buf,in_RCX);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_1d8);
  iVar6 = 0x19;
  if (-1 < width) {
    iVar6 = width;
  }
  uVar8 = 0;
  uVar7 = (ulong)local_1d0;
  if ((int)local_1d0 < 1) {
    uVar7 = uVar8;
  }
  iVar4 = 1;
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    std::__cxx11::stringbuf::str();
    bVar1 = *(byte *)(local_1d8 + uVar8);
    std::__cxx11::string::~string((string *)&local_1d8);
    lVar2 = *(long *)out;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(out + lVar3 + 0x18) = *(uint *)(out + lVar3 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 2;
    this_00 = std::operator<<(out,0x30);
    std::ostream::operator<<(this_00,(uint)bVar1);
    if (iVar6 == 0) {
      if ((long)uVar8 < (long)(int)(local_1d0 - 1)) {
        std::operator<<(out,' ');
      }
    }
    else {
      if ((long)uVar8 < (long)(int)(local_1d0 - 1)) {
        cVar5 = '\n';
        if (iVar4 % iVar6 != 0) {
          cVar5 = ' ';
        }
        std::operator<<(out,cVar5);
      }
      iVar4 = iVar4 + 1;
    }
  }
  if (iVar6 != 0) {
    std::operator<<(out,'\n');
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&tempstream);
  return true;
}

Assistant:

bool MidiFile::writeHex(std::ostream& out, int width) {
	std::stringstream tempstream;
	MidiFile::write(tempstream);
	int len = (int)tempstream.str().length();
	int wordcount = 1;
	int linewidth = width >= 0 ? width : 25;
	for (int i=0; i<len; i++) {
		int value = (uchar)tempstream.str()[i];
		out << std::hex << std::setw(2) << std::setfill('0') << value;
		if (linewidth) {
			if (i < len - 1) {
				out << ((wordcount % linewidth) ? ' ' : '\n');
			}
			wordcount++;
		} else {
			// print with no line breaks
			if (i < len - 1) {
				out << ' ';
			}
		}
	}
	if (linewidth) {
		out << '\n';
	}
	return true;
}